

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void __thiscall
duckdb::AggregateExecutor::
UnaryUpdate<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintAverageOperation>
          (AggregateExecutor *this,Vector *input,AggregateInputData *aggr_input_data,
          data_ptr_t state,idx_t count)

{
  undefined8 *puVar1;
  hugeint_t lhs;
  hugeint_t lhs_00;
  hugeint_t lhs_01;
  hugeint_t rhs;
  hugeint_t rhs_00;
  hugeint_t rhs_01;
  hugeint_t rhs_02;
  UnifiedVectorFormat *pUVar2;
  ulong uVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  UnifiedVectorFormat *pUVar8;
  ulong uVar9;
  FunctionData *pFVar10;
  hugeint_t input_00;
  hugeint_t hVar11;
  UnifiedVectorFormat idata;
  uint64_t in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff68;
  long lVar12;
  uint64_t uVar13;
  int64_t in_stack_ffffffffffffff70;
  ulong uVar14;
  long *local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*this == (AggregateExecutor)0x0) {
    lVar12 = *(long *)(this + 0x20);
    FlatVector::VerifyFlatVector((Vector *)this);
    if ((data_ptr_t)0x3f < state + 0x3f) {
      uVar14 = (ulong)(state + 0x3f) >> 6;
      uVar13 = lVar12 + 8;
      uVar3 = 0;
      pdVar6 = (data_ptr_t)0x0;
      do {
        if (*(long *)(this + 0x28) == 0) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar9 = *(ulong *)(*(long *)(this + 0x28) + uVar3 * 8);
        }
        pdVar4 = pdVar6 + 0x40;
        if (state <= pdVar6 + 0x40) {
          pdVar4 = state;
        }
        pdVar7 = pdVar4;
        if (uVar9 != 0) {
          pdVar7 = pdVar6;
          if (uVar9 == 0xffffffffffffffff) {
            if (pdVar6 < pdVar4) {
              pFVar10 = (aggr_input_data->bind_data).ptr;
              do {
                pFVar10 = pFVar10 + 1;
                (aggr_input_data->bind_data).ptr = pFVar10;
                lhs.upper = (int64_t)state;
                lhs.lower = in_stack_ffffffffffffff58;
                rhs.upper = uVar14;
                rhs.lower = uVar13;
                hVar11 = Hugeint::Add<true>(lhs,rhs);
                *(hugeint_t *)&aggr_input_data->allocator = hVar11;
                pdVar7 = pdVar7 + 1;
              } while (pdVar4 != pdVar7);
            }
          }
          else if (pdVar6 < pdVar4) {
            uVar5 = 0;
            do {
              if ((uVar9 >> (uVar5 & 0x3f) & 1) != 0) {
                (aggr_input_data->bind_data).ptr = (aggr_input_data->bind_data).ptr + 1;
                hVar11.upper = (int64_t)state;
                hVar11.lower = in_stack_ffffffffffffff58;
                rhs_00.upper = uVar14;
                rhs_00.lower = uVar13;
                hVar11 = Hugeint::Add<true>(hVar11,rhs_00);
                *(hugeint_t *)&aggr_input_data->allocator = hVar11;
              }
              uVar5 = uVar5 + 1;
            } while (pdVar6 + (uVar5 - (long)pdVar4) != (data_ptr_t)0x0);
            pdVar7 = pdVar6 + uVar5;
          }
        }
        uVar3 = uVar3 + 1;
        pdVar6 = pdVar7;
      } while (uVar3 != uVar14);
    }
  }
  else if (*this == (AggregateExecutor)0x2) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      (aggr_input_data->bind_data).ptr =
           (FunctionData *)(state + (long)(aggr_input_data->bind_data).ptr);
      input_00.upper = (int64_t)state;
      input_00.lower = puVar1[1];
      HugeintAdd::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t>
                ((HugeintAdd *)aggr_input_data,(AvgState<duckdb::hugeint_t> *)*puVar1,input_00,count
                );
      return;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)this,(UnifiedVectorFormat *)state);
    if (local_68 == 0) {
      if ((UnifiedVectorFormat *)state != (UnifiedVectorFormat *)0x0) {
        pFVar10 = (aggr_input_data->bind_data).ptr;
        pUVar8 = (UnifiedVectorFormat *)0x0;
        do {
          (aggr_input_data->bind_data).ptr = (FunctionData *)(pUVar8 + (long)(pFVar10 + 1));
          lhs_01.upper = (int64_t)state;
          lhs_01.lower = in_stack_ffffffffffffff58;
          rhs_02.upper = in_stack_ffffffffffffff70;
          rhs_02.lower = in_stack_ffffffffffffff68;
          hVar11 = Hugeint::Add<true>(lhs_01,rhs_02);
          *(hugeint_t *)&aggr_input_data->allocator = hVar11;
          pUVar8 = pUVar8 + 1;
        } while ((UnifiedVectorFormat *)state != pUVar8);
      }
    }
    else if ((UnifiedVectorFormat *)state != (UnifiedVectorFormat *)0x0) {
      lVar12 = *local_78[0];
      pUVar8 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar2 = pUVar8;
        if (lVar12 != 0) {
          pUVar2 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar12 + (long)pUVar8 * 4);
        }
        if ((local_68 == 0) ||
           ((*(ulong *)(local_68 + ((ulong)pUVar2 >> 6) * 8) >> ((ulong)pUVar2 & 0x3f) & 1) != 0)) {
          (aggr_input_data->bind_data).ptr = (aggr_input_data->bind_data).ptr + 1;
          lhs_00.upper = (int64_t)state;
          lhs_00.lower = in_stack_ffffffffffffff58;
          rhs_01.upper = in_stack_ffffffffffffff70;
          rhs_01.lower = in_stack_ffffffffffffff68;
          hVar11 = Hugeint::Add<true>(lhs_00,rhs_01);
          *(hugeint_t *)&aggr_input_data->allocator = hVar11;
        }
        pUVar8 = pUVar8 + 1;
      } while ((UnifiedVectorFormat *)state != pUVar8);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}